

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O2

void __thiscall
nh_ugens::BaseDelay::BaseDelay(BaseDelay *this,float sample_rate,float max_delay,float delay)

{
  int iVar1;
  int iVar2;
  
  this->m_buffer = (float *)0x0;
  this->m_sample_rate = sample_rate;
  iVar1 = 1;
  do {
    iVar2 = iVar1;
    iVar1 = iVar2 * 2;
  } while (iVar2 < (int)(max_delay * sample_rate));
  this->m_size = iVar2;
  this->m_mask = iVar2 + -1;
  this->m_read_position = 0;
  this->m_delay = delay;
  this->m_delay_in_samples = (int)(sample_rate * delay);
  return;
}

Assistant:

BaseDelay(
        float sample_rate,
        float max_delay,
        float delay
    ) :
    m_sample_rate(sample_rate)
    {
        int max_delay_in_samples = m_sample_rate * max_delay;
        m_size = next_power_of_two(max_delay_in_samples);
        m_mask = m_size - 1;

        m_read_position = 0;

        m_delay = delay;
        m_delay_in_samples = m_sample_rate * delay;
    }